

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

offset_t __thiscall ser::OffsetTable::GetOffset(OffsetTable *this,int savepointID,string *fieldName)

{
  pointer pmVar1;
  const_iterator cVar2;
  ostream *poVar3;
  SerializationException *pSVar4;
  ulong uVar5;
  SerializationException exception;
  ostringstream msg;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [24];
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [376];
  
  pmVar1 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->entries_).
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 4) *
          -0x5555555555555555;
  if (uVar5 < (uint)savepointID || uVar5 - (uint)savepointID == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error: savepoint with ID ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,savepointID);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not registered in table\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Retrieving the offset of the field ",0x23);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not possible\n",0x11);
    local_1e8._M_p = local_1e0 + 8;
    local_1f0 = (undefined1  [8])&PTR__SerializationException_001348a8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_1e8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,(SerializationException *)local_1f0);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
          ::find(&pmVar1[savepointID]._M_t,fieldName);
  if (cVar2._M_node != &pmVar1[savepointID]._M_t._M_impl.super__Rb_tree_header._M_header) {
    return *(offset_t *)(cVar2._M_node + 2);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error: field ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," is not registered at the savepoint ",0x24);
  Savepoint::ToString_abi_cxx11_
            ((string *)local_1f0,
             (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
             ._M_impl.super__Vector_impl_data._M_start + savepointID);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_1f0,(long)local_1e8._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0);
  }
  local_1e8._M_p = local_1e0 + 8;
  local_1f0 = (undefined1  [8])&PTR__SerializationException_001348a8;
  local_1e0._0_8_ = 0;
  local_1e0[8] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1e8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,(SerializationException *)local_1f0);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(int savepointID, const std::string& fieldName) const
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check that field is saved at savepoint
    const OffsetTableEntry& entry = entries_[savepointID];
    const_iterator iter = entry.find(fieldName);
    if (iter == entry.end())
    {
        std::ostringstream msg;
        msg << "Error: field " << fieldName << " is not registered at the savepoint "
            << savepoints_[savepointID].ToString() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Return offset
    return iter->second.offset;
}